

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O1

void __thiscall
re2::NFA::AddToThreadq(NFA *this,Threadq *q,int id0,int c,StringPiece *context,char *p,Thread *t0)

{
  ushort uVar1;
  int iVar2;
  AddState *pAVar3;
  IndexValue *pIVar4;
  Inst *pIVar5;
  char **ppcVar6;
  bool bVar7;
  uint32_t uVar8;
  Thread **ppTVar9;
  ostream *poVar10;
  Thread *pTVar11;
  char **ppcVar12;
  uint uVar13;
  int iVar14;
  Thread *pTVar15;
  _Head_base<1UL,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter,_false> i
  ;
  ulong uVar16;
  int iVar17;
  ulong local_1e8;
  LogMessage local_1b0;
  
  if (id0 != 0) {
    pAVar3 = (this->stack_).ptr_._M_t.
             super___uniq_ptr_impl<re2::NFA::AddState,_re2::PODArray<re2::NFA::AddState>::Deleter>.
             _M_t.
             super__Tuple_impl<0UL,_re2::NFA::AddState_*,_re2::PODArray<re2::NFA::AddState>::Deleter>
             .super__Head_base<0UL,_re2::NFA::AddState_*,_false>._M_head_impl;
    pAVar3->id = id0;
    pAVar3->t = (Thread *)0x0;
    local_1e8 = 1;
    do {
      local_1e8 = (ulong)((int)local_1e8 - 1);
      i._M_head_impl.len_ = (Deleter)pAVar3[local_1e8].id;
      pTVar11 = pAVar3[local_1e8].t;
      pTVar15 = t0;
      do {
        t0 = pTVar15;
        if (((pTVar11 != (Thread *)0x0) && (t0 = pTVar11, pTVar15 != (Thread *)0x0)) &&
           (iVar14 = (pTVar15->field_0).ref, (pTVar15->field_0).ref = iVar14 + -1, iVar14 < 2)) {
          pTVar15->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
          this->free_threads_ = pTVar15;
        }
        if (i._M_head_impl.len_ == 0) {
          i._M_head_impl.len_ = (Deleter)0;
LAB_001c5d83:
          bVar7 = false;
          goto LAB_001c5fd2;
        }
        pIVar4 = (q->dense_).ptr_._M_t.
                 super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                 .super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>.
                 _M_head_impl;
        if (((pIVar4 != (IndexValue *)0x0) &&
            ((uint)i._M_head_impl.len_ <
             (uint)*(int *)&(q->dense_).ptr_._M_t.
                            super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                            .
                            super__Tuple_impl<1UL,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                            .
                            super__Head_base<1UL,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter,_false>
            )) && ((uVar13 = (q->sparse_).ptr_._M_t.
                             super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                             super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                             super__Head_base<0UL,_int_*,_false>._M_head_impl
                             [(int)i._M_head_impl.len_], uVar13 < (uint)q->size_ &&
                   ((Deleter)pIVar4[(int)uVar13].index_ == i._M_head_impl.len_))))
        goto LAB_001c5d83;
        local_1b0.flushed_ = false;
        local_1b0._1_7_ = 0;
        bVar7 = false;
        SparseArray<re2::NFA::Thread_*>::SetInternal
                  (q,false,(int)i._M_head_impl.len_,(Thread **)&local_1b0);
        ppTVar9 = &(q->dense_).ptr_._M_t.
                   super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                   .super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>
                   ._M_head_impl
                   [(q->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>.
                    _M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                    super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)i._M_head_impl.len_]].
                   value_;
        pIVar5 = ((_Head_base<0UL,_re2::Prog::Inst_*,_false> *)
                 ((long)&(this->prog_->inst_).ptr_._M_t.
                         super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                 + 8))->_M_head_impl;
        uVar13 = pIVar5[(int)i._M_head_impl.len_].out_opcode_;
        iVar14 = (int)local_1e8;
        switch(uVar13 & 7) {
        case 0:
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/nfa.cc"
                     ,0xf7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0.str_,"unhandled ",10);
          poVar10 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)&local_1b0.str_,
                               pIVar5[(int)i._M_head_impl.len_].out_opcode_ & 7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," in AddToThreadq",0x10);
          LogMessage::~LogMessage(&local_1b0);
LAB_001c5dd5:
          bVar7 = false;
          break;
        case 1:
          (t0->field_0).ref = (t0->field_0).ref + 1;
          *ppTVar9 = t0;
LAB_001c5e8b:
          i._M_head_impl.len_ = (Deleter)((int)i._M_head_impl.len_ + 1);
          goto LAB_001c5fc8;
        case 2:
          uVar13 = c;
          if ((pIVar5[(int)i._M_head_impl.len_].field_1.out1_ & 0x10000) != 0) {
            uVar13 = c | 0x20;
          }
          if (0x19 < c - 0x41U) {
            uVar13 = c;
          }
          if (((int)uVar13 < (int)(uint)pIVar5[(int)i._M_head_impl.len_].field_1.field_3.lo_) ||
             ((int)(uint)pIVar5[(int)i._M_head_impl.len_].field_1.field_3.hi_ < (int)uVar13))
          goto LAB_001c5e84;
          (t0->field_0).ref = (t0->field_0).ref + 1;
          *ppTVar9 = t0;
          uVar1 = pIVar5[(int)i._M_head_impl.len_].field_1.field_3.hint_foldcase_;
          if (uVar1 < 2) goto LAB_001c5e92;
          i._M_head_impl.len_ = (Deleter)((int)i._M_head_impl.len_ + (uint)(uVar1 >> 1));
          goto LAB_001c5fc8;
        case 3:
          if ((uVar13 & 8) == 0) {
            local_1e8 = (ulong)(iVar14 + 1);
            pAVar3[iVar14].id = (int)i._M_head_impl.len_ + 1;
            pAVar3[iVar14].t = (Thread *)0x0;
          }
          iVar14 = pIVar5[(int)i._M_head_impl.len_].field_1.cap_;
          if (iVar14 < this->ncapture_) {
            iVar17 = (int)local_1e8;
            pAVar3[iVar17].id = 0;
            pAVar3[iVar17].t = t0;
            pTVar11 = this->free_threads_;
            if (pTVar11 == (Thread *)0x0) {
              pTVar11 = (Thread *)operator_new(0x10);
              (pTVar11->field_0).ref = 1;
              uVar16 = (long)this->ncapture_ * 8;
              if ((long)this->ncapture_ < 0) {
                uVar16 = 0xffffffffffffffff;
              }
              ppcVar12 = (char **)operator_new__(uVar16);
              pTVar11->capture = ppcVar12;
            }
            else {
              this->free_threads_ = (Thread *)pTVar11->field_0;
              (pTVar11->field_0).ref = 1;
            }
            iVar2 = this->ncapture_;
            if (0 < (long)iVar2) {
              ppcVar12 = pTVar11->capture;
              ppcVar6 = t0->capture;
              uVar16 = 0;
              do {
                ppcVar12[uVar16] = ppcVar6[uVar16];
                ppcVar12[uVar16 + 1] = ppcVar6[uVar16 + 1];
                uVar16 = uVar16 + 2;
              } while (uVar16 < (ulong)(long)iVar2);
            }
            local_1e8 = (ulong)(iVar17 + 1);
            pTVar11->capture[iVar14] = p;
            t0 = pTVar11;
          }
          goto LAB_001c5fc1;
        case 4:
          if ((uVar13 & 8) == 0) {
            local_1e8 = (ulong)(iVar14 + 1);
            pAVar3[iVar14].id = (int)i._M_head_impl.len_ + 1;
            pAVar3[iVar14].t = (Thread *)0x0;
          }
          uVar13 = pIVar5[(int)i._M_head_impl.len_].field_1.out1_;
          uVar8 = Prog::EmptyFlags(context,p);
          if ((uVar13 & ~uVar8) != 0) goto LAB_001c5dd5;
          i._M_head_impl.len_ = (Deleter)(pIVar5[(int)i._M_head_impl.len_].out_opcode_ >> 4);
          bVar7 = true;
          pTVar11 = (Thread *)0x0;
          break;
        case 5:
          (t0->field_0).ref = (t0->field_0).ref + 1;
          *ppTVar9 = t0;
LAB_001c5e84:
          if ((pIVar5[(int)i._M_head_impl.len_].out_opcode_ & 8) == 0) goto LAB_001c5e8b;
LAB_001c5e92:
          bVar7 = false;
          break;
        case 6:
          if ((uVar13 & 8) == 0) {
            local_1e8 = (ulong)(iVar14 + 1);
            pAVar3[iVar14].id = (int)i._M_head_impl.len_ + 1;
            pAVar3[iVar14].t = (Thread *)0x0;
          }
LAB_001c5fc1:
          i._M_head_impl.len_ = (Deleter)(pIVar5[(int)i._M_head_impl.len_].out_opcode_ >> 4);
LAB_001c5fc8:
          bVar7 = true;
          pTVar11 = (Thread *)0x0;
          break;
        case 7:
        }
LAB_001c5fd2:
        pTVar15 = t0;
      } while (bVar7);
    } while (0 < (int)local_1e8);
  }
  return;
}

Assistant:

void NFA::AddToThreadq(Threadq* q, int id0, int c, const StringPiece& context,
                       const char* p, Thread* t0) {
  if (id0 == 0)
    return;

  // Use stack_ to hold our stack of instructions yet to process.
  // It was preallocated as follows:
  //   two entries per Capture;
  //   one entry per EmptyWidth; and
  //   one entry per Nop.
  // This reflects the maximum number of stack pushes that each can
  // perform. (Each instruction can be processed at most once.)
  AddState* stk = stack_.data();
  int nstk = 0;

  stk[nstk++] = {id0, NULL};
  while (nstk > 0) {
    DCHECK_LE(nstk, stack_.size());
    AddState a = stk[--nstk];

  Loop:
    if (a.t != NULL) {
      // t0 was a thread that we allocated and copied in order to
      // record the capture, so we must now decref it.
      Decref(t0);
      t0 = a.t;
    }

    int id = a.id;
    if (id == 0)
      continue;
    if (q->has_index(id)) {
      if (ExtraDebug)
        fprintf(stderr, "  [%d%s]\n", id, FormatCapture(t0->capture).c_str());
      continue;
    }

    // Create entry in q no matter what.  We might fill it in below,
    // or we might not.  Even if not, it is necessary to have it,
    // so that we don't revisit id0 during the recursion.
    q->set_new(id, NULL);
    Thread** tp = &q->get_existing(id);
    int j;
    Thread* t;
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
    default:
      LOG(DFATAL) << "unhandled " << ip->opcode() << " in AddToThreadq";
      break;

    case kInstFail:
      break;

    case kInstAltMatch:
      // Save state; will pick up at next byte.
      t = Incref(t0);
      *tp = t;

      DCHECK(!ip->last());
      a = {id+1, NULL};
      goto Loop;

    case kInstNop:
      if (!ip->last())
        stk[nstk++] = {id+1, NULL};

      // Continue on.
      a = {ip->out(), NULL};
      goto Loop;

    case kInstCapture:
      if (!ip->last())
        stk[nstk++] = {id+1, NULL};

      if ((j=ip->cap()) < ncapture_) {
        // Push a dummy whose only job is to restore t0
        // once we finish exploring this possibility.
        stk[nstk++] = {0, t0};

        // Record capture.
        t = AllocThread();
        CopyCapture(t->capture, t0->capture);
        t->capture[j] = p;
        t0 = t;
      }
      a = {ip->out(), NULL};
      goto Loop;

    case kInstByteRange:
      if (!ip->Matches(c))
        goto Next;

      // Save state; will pick up at next byte.
      t = Incref(t0);
      *tp = t;
      if (ExtraDebug)
        fprintf(stderr, " + %d%s\n", id, FormatCapture(t0->capture).c_str());

      if (ip->hint() == 0)
        break;
      a = {id+ip->hint(), NULL};
      goto Loop;

    case kInstMatch:
      // Save state; will pick up at next byte.
      t = Incref(t0);
      *tp = t;
      if (ExtraDebug)
        fprintf(stderr, " ! %d%s\n", id, FormatCapture(t0->capture).c_str());

    Next:
      if (ip->last())
        break;
      a = {id+1, NULL};
      goto Loop;

    case kInstEmptyWidth:
      if (!ip->last())
        stk[nstk++] = {id+1, NULL};

      // Continue on if we have all the right flag bits.
      if (ip->empty() & ~Prog::EmptyFlags(context, p))
        break;
      a = {ip->out(), NULL};
      goto Loop;
    }
  }
}